

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O1

int mbedtls_mpi_safe_cond_assign(mbedtls_mpi *X,mbedtls_mpi *Y,uchar assign)

{
  ushort uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  mbedtls_mpi_uint *pmVar4;
  int iVar5;
  ulong uVar6;
  mbedtls_mpi_uint mVar7;
  ulong uVar8;
  
  iVar5 = mbedtls_mpi_grow(X,(ulong)Y->n);
  if (iVar5 == 0) {
    uVar8 = -((assign ^ mbedtls_ct_zero) >> 1) | -(assign ^ mbedtls_ct_zero);
    uVar2 = Y->s;
    uVar3 = X->s;
    uVar1 = (ushort)((long)uVar8 >> 0x3f);
    X->s = (uVar2 + 1 & uVar1 | ~((ushort)mbedtls_ct_zero ^ uVar1) & uVar3 + 1) - 1;
    mbedtls_mpi_core_cond_assign(X->p,Y->p,(ulong)Y->n,(long)uVar8 >> 0x3f);
    uVar6 = (ulong)Y->n;
    uVar1 = X->n;
    if (Y->n < uVar1) {
      pmVar4 = X->p;
      do {
        if ((long)uVar8 < 0) {
          mVar7 = 0;
        }
        else {
          mVar7 = pmVar4[uVar6];
        }
        pmVar4[uVar6] = mVar7;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
  }
  return iVar5;
}

Assistant:

__declspec(noinline)
#endif
int mbedtls_mpi_safe_cond_assign(mbedtls_mpi *X,
                                 const mbedtls_mpi *Y,
                                 unsigned char assign)
{
    int ret = 0;

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, Y->n));

    {
        mbedtls_ct_condition_t do_assign = mbedtls_ct_bool(assign);

        X->s = mbedtls_ct_mpi_sign_if(do_assign, Y->s, X->s);

        mbedtls_mpi_core_cond_assign(X->p, Y->p, Y->n, do_assign);

        mbedtls_ct_condition_t do_not_assign = mbedtls_ct_bool_not(do_assign);
        for (size_t i = Y->n; i < X->n; i++) {
            X->p[i] = mbedtls_ct_mpi_uint_if_else_0(do_not_assign, X->p[i]);
        }
    }

cleanup:
    return ret;
}